

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O0

void sylvan_set_limits(size_t memorycap,int table_ratio,int initial_ratio)

{
  bool bVar1;
  ulong local_40;
  size_t min_c;
  size_t min_t;
  size_t cur;
  size_t max_c;
  size_t max_t;
  int initial_ratio_local;
  int table_ratio_local;
  size_t memorycap_local;
  
  if ((table_ratio < -10) || (10 < table_ratio)) {
    fprintf(_stderr,"sylvan_set_limits: table_ratio unreasonable (between -10 and 10)\n");
    exit(1);
  }
  max_c = 1;
  cur = 1;
  if (table_ratio < 1) {
    cur = 1L << (-(byte)table_ratio & 0x3f);
  }
  else {
    max_c = 1L << ((byte)table_ratio & 0x3f);
  }
  min_t = max_c * 0x18 + cur * 0x24;
  if (memorycap < min_t) {
    fprintf(_stderr,"sylvan_set_limits: memory cap incompatible with requested table ratio\n");
  }
  for (; min_t << 1 < memorycap && max_c < 0x40000000000; min_t = min_t << 1) {
    max_c = max_c << 1;
    cur = cur << 1;
  }
  if (initial_ratio < 0) {
    fprintf(_stderr,"sylvan_set_limits: initial_ratio unreasonable (may not be negative)\n");
    exit(1);
  }
  min_c = max_c;
  local_40 = cur;
  max_t._0_4_ = initial_ratio;
  while( true ) {
    bVar1 = false;
    if ((0 < (int)max_t) && (bVar1 = false, 0x1000 < min_c)) {
      bVar1 = 0x1000 < local_40;
    }
    if (!bVar1) break;
    min_c = min_c >> 1;
    local_40 = local_40 >> 1;
    max_t._0_4_ = (int)max_t + -1;
  }
  table_min = min_c;
  table_max = max_c;
  cache_min = local_40;
  cache_max = cur;
  return;
}

Assistant:

void
sylvan_set_limits(size_t memorycap, int table_ratio, int initial_ratio)
{
    /* This method ONLY limits the "unique nodes table" and the "operation cache" which are the main
     * datastructures of Sylvan.
     *
     * Suggested limits:
     * - memorycap to whatever you want at most, in bytes.
     * - table_ratio to a number between -3 (8x bigger cache) and 3 (8x bigger nodes table)
     * - inital_ratio to something like 10 (start with 1024x smaller tables initially)
     */
    if (table_ratio < -10 || table_ratio > 10) {
        fprintf(stderr, "sylvan_set_limits: table_ratio unreasonable (between -10 and 10)\n");
        exit(1);
    }

    size_t max_t = 1;
    size_t max_c = 1;
    if (table_ratio > 0) {
        max_t <<= table_ratio;
    } else {
        max_c <<= -table_ratio;
    }

    size_t cur = max_t * 24 + max_c * 36;
    if (cur > memorycap) {
        fprintf(stderr, "sylvan_set_limits: memory cap incompatible with requested table ratio\n");
    }

    while (2*cur < memorycap && max_t < 0x0000040000000000) {
        max_t *= 2;
        max_c *= 2;
        cur *= 2;
    }

    if (initial_ratio < 0) {
        fprintf(stderr, "sylvan_set_limits: initial_ratio unreasonable (may not be negative)\n");
        exit(1);
    }

    size_t min_t = max_t, min_c = max_c;
    while (initial_ratio > 0 && min_t > 0x1000 && min_c > 0x1000) {
        min_t >>= 1;
        min_c >>= 1;
        initial_ratio--;
    }

    table_min = min_t;
    table_max = max_t;
    cache_min = min_c;
    cache_max = max_c;
}